

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O3

string * tinyusdz::escapeSingleQuote
                   (string *__return_storage_ptr__,string *str,bool is_double_quote)

{
  undefined3 in_register_00000011;
  ulong uVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (CONCAT31(in_register_00000011,is_double_quote) == 0) {
    if (str->_M_string_length != 0) {
      uVar1 = 0;
      do {
        if ((str->_M_dataplus)._M_p[uVar1] == '\'') {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        else {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
        uVar1 = uVar1 + 1;
      } while (uVar1 < str->_M_string_length);
    }
  }
  else if (str->_M_string_length != 0) {
    uVar1 = 0;
    do {
      if ((str->_M_dataplus)._M_p[uVar1] == '\"') {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < str->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string escapeSingleQuote(const std::string &str,
                              const bool is_double_quote) {
  std::string s;

  if (is_double_quote) {
    for (size_t i = 0; i < str.size(); i++) {
      if (str[i] == '"') {
        s += "\\\"";
      } else {
        s += str[i];
      }
    }
  } else {
    for (size_t i = 0; i < str.size(); i++) {
      if (str[i] == '\'') {
        s += "\\'";
      } else {
        s += str[i];
      }
    }
  }

  return s;
}